

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

int __thiscall
kj::CapabilityStreamNetworkAddress::connect
          (CapabilityStreamNetworkAddress *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> *pOVar1;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> *other;
  undefined4 in_register_00000034;
  AsyncCapabilityStream *pAVar2;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> local_d0;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> local_c0;
  undefined1 local_b0 [16];
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> result;
  CapabilityPipe local_78;
  AsyncIoProvider *local_58;
  AsyncIoProvider *p;
  AsyncIoProvider *local_40;
  AsyncIoProvider *_p2782;
  CapabilityPipe pipe;
  CapabilityStreamNetworkAddress *this_local;
  
  pAVar2 = (AsyncCapabilityStream *)CONCAT44(in_register_00000034,__fd);
  pipe.ends[1].ptr = pAVar2;
  CapabilityPipe::CapabilityPipe((CapabilityPipe *)&_p2782);
  local_40 = kj::_::readMaybe<kj::AsyncIoProvider>
                       ((Maybe<kj::AsyncIoProvider_&> *)
                        &(pAVar2->super_AsyncIoStream).super_AsyncOutputStream);
  if (local_40 == (AsyncIoProvider *)0x0) {
    newCapabilityPipe();
    CapabilityPipe::operator=((CapabilityPipe *)&_p2782,(CapabilityPipe *)&result.ptr);
    CapabilityPipe::~CapabilityPipe((CapabilityPipe *)&result.ptr);
  }
  else {
    local_58 = local_40;
    (*local_40->_vptr_AsyncIoProvider[2])(&local_78);
    CapabilityPipe::operator=((CapabilityPipe *)&_p2782,&local_78);
    CapabilityPipe::~CapabilityPipe(&local_78);
  }
  pOVar1 = mv<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>
                     ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&_p2782);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::Own
            ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)(local_b0 + 8),pOVar1);
  pOVar1 = (Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)
           pAVar2[1].super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  other = mv<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>
                    ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&pipe.ends[0].ptr);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::Own(&local_c0,other);
  AsyncCapabilityStream::sendStream((AsyncCapabilityStream *)local_b0,pOVar1);
  pOVar1 = mv<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>
                     ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)(local_b0 + 8));
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::Own(&local_d0,pOVar1);
  Promise<void>::then<kj::CapabilityStreamNetworkAddress::connect()::__0>
            ((Promise<void> *)this,(Type *)local_b0);
  connect()::$_0::~__0((__0 *)&local_d0);
  Promise<void>::~Promise((Promise<void> *)local_b0);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::~Own(&local_c0);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)(local_b0 + 8));
  CapabilityPipe::~CapabilityPipe((CapabilityPipe *)&_p2782);
  return (int)this;
}

Assistant:

Promise<Own<AsyncIoStream>> CapabilityStreamNetworkAddress::connect() {
  CapabilityPipe pipe;
  KJ_IF_SOME(p, provider) {
    pipe = p.newCapabilityPipe();
  } else {
    pipe = kj::newCapabilityPipe();
  }